

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

bool __thiscall
MT32Emu::Synth::initTimbres
          (Synth *this,Bit16u mapAddress,Bit16u offset,Bit16u count,Bit16u startTimbre,
          bool compressed)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  undefined6 in_register_0000000a;
  ulong uVar4;
  uint uVar5;
  undefined6 in_register_00000032;
  char *fmt;
  ulong uVar6;
  ushort uVar7;
  ulong uVar8;
  
  iVar3 = (int)CONCAT62(in_register_0000000a,count);
  if (iVar3 != 0) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar1 = *(ushort *)
               (this->controlROMData +
               (ulong)uVar7 + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff));
      uVar6 = (ulong)uVar1;
      if (compressed) {
        uVar5 = (uint)uVar1 + (uint)offset & 0xffff;
        bVar2 = initCompressedTimbre(this,startTimbre,this->controlROMData + uVar5,0x10000 - uVar5);
        if (!bVar2) {
          fmt = 
          "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x"
          ;
          uVar4 = (ulong)startTimbre;
          uVar6 = (ulong)uVar5;
LAB_001797a4:
          printDebug(this,fmt,uVar8,uVar4,uVar6);
          return false;
        }
      }
      else {
        if (0xff0a < (uint)uVar1 + (uint)offset) {
          fmt = 
          "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x"
          ;
          uVar4 = (ulong)(uint)startTimbre;
          goto LAB_001797a4;
        }
        MemoryRegion::write(&this->timbresMemoryRegion->super_MemoryRegion,(uint)startTimbre,
                            (void *)0x0,
                            (size_t)(this->controlROMData + ((uint)uVar1 + (uint)offset & 0xffff)));
      }
      startTimbre = startTimbre + 1;
      uVar7 = uVar7 + 2;
      uVar8 = (ulong)uVar7;
    } while ((uint)uVar7 < (uint)(iVar3 * 2));
  }
  return true;
}

Assistant:

bool Synth::initTimbres(Bit16u mapAddress, Bit16u offset, Bit16u count, Bit16u startTimbre, bool compressed) {
	const Bit8u *timbreMap = &controlROMData[mapAddress];
	for (Bit16u i = 0; i < count * 2; i += 2) {
		Bit16u address = (timbreMap[i + 1] << 8) | timbreMap[i];
		if (!compressed && (address + offset + sizeof(TimbreParam) > CONTROL_ROM_SIZE)) {
			printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x", i, startTimbre, address);
			return false;
		}
		address += offset;
		if (compressed) {
			if (!initCompressedTimbre(startTimbre, &controlROMData[address], CONTROL_ROM_SIZE - address)) {
				printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x", i, startTimbre, address);
				return false;
			}
		} else {
			timbresMemoryRegion->write(startTimbre, 0, &controlROMData[address], sizeof(TimbreParam), true);
		}
		startTimbre++;
	}
	return true;
}